

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O2

int coda_is_identifier(char *name)

{
  char cVar1;
  ushort **ppuVar2;
  char *pcVar3;
  
  if (name != (char *)0x0) {
    ppuVar2 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar2 + (long)*name * 2 + 1) & 4) != 0) {
      pcVar3 = name + 1;
      do {
        cVar1 = *pcVar3;
        if ((long)cVar1 == 0) {
          return 1;
        }
        pcVar3 = pcVar3 + 1;
      } while ((cVar1 == '_') || (((*ppuVar2)[cVar1] & 8) != 0));
    }
  }
  return 0;
}

Assistant:

int coda_is_identifier(const char *name)
{
    int i;

    if (name == NULL)
    {
        return 0;
    }
    if (!isalpha(*name))
    {
        return 0;
    }
    i = 1;
    while (name[i] != '\0')
    {
        if (!(isalnum(name[i]) || name[i] == '_'))
        {
            return 0;
        }
        i++;
    }
    return 1;
}